

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

Orientation p2t::Orient2d(Point *pa,Point *pb,Point *pc)

{
  Orientation OVar1;
  double dVar2;
  
  dVar2 = (pb->y - pc->y) * (pa->x - pc->x) - (pb->x - pc->x) * (pa->y - pc->y);
  OVar1 = COLLINEAR;
  if (1e-12 <= ABS(dVar2)) {
    OVar1 = (Orientation)(0.0 < dVar2);
  }
  return OVar1;
}

Assistant:

Orientation Orient2d(const Point& pa, const Point& pb, const Point& pc)
{
  double detleft = (pa.x - pc.x) * (pb.y - pc.y);
  double detright = (pa.y - pc.y) * (pb.x - pc.x);
  double val = detleft - detright;
  if (val > -EPSILON && val < EPSILON) {
    return COLLINEAR;
  } else if (val > 0) {
    return CCW;
  }
  return CW;
}